

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t validation_layer::zeKernelDestroy(ze_kernel_handle_t hKernel)

{
  Logger *this;
  code *pcVar1;
  long *plVar2;
  long lVar3;
  ze_result_t result;
  ze_result_t zVar4;
  size_t i;
  long lVar5;
  long lVar6;
  size_t i_1;
  allocator local_51;
  string local_50;
  
  lVar3 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string((string *)&local_50,"zeKernelDestroy(hKernel)",&local_51);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar1 = *(code **)(lVar3 + 0x560);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(lVar3 + 0xd38) - *(long *)(lVar3 + 0xd30) >> 3;
    lVar5 = 0;
    do {
      if (lVar6 == lVar5) {
        if ((*(char *)(lVar3 + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeKernelDestroyPrologue
                               (*(ZEHandleLifetimeValidation **)(lVar3 + 0xd48),hKernel),
           result == ZE_RESULT_SUCCESS)) {
          zVar4 = (*pcVar1)(hKernel);
          lVar5 = 0;
          goto LAB_00151ac0;
        }
        break;
      }
      plVar2 = (long *)**(undefined8 **)(*(long *)(lVar3 + 0xd30) + lVar5 * 8);
      result = (**(code **)(*plVar2 + 0x720))(plVar2,hKernel);
      lVar5 = lVar5 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_00151aeb;
  while( true ) {
    plVar2 = (long *)**(undefined8 **)(*(long *)(lVar3 + 0xd30) + lVar5 * 8);
    result = (**(code **)(*plVar2 + 0x728))(plVar2,hKernel,zVar4);
    lVar5 = lVar5 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_00151ac0:
    result = zVar4;
    if (lVar6 == lVar5) break;
  }
LAB_00151aeb:
  logAndPropagateResult("zeKernelDestroy",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelDestroy(
        ze_kernel_handle_t hKernel                      ///< [in][release] handle of the kernel object
        )
    {
        context.logger->log_trace("zeKernelDestroy(hKernel)");

        auto pfnDestroy = context.zeDdiTable.Kernel.pfnDestroy;

        if( nullptr == pfnDestroy )
            return logAndPropagateResult("zeKernelDestroy", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeKernelDestroyPrologue( hKernel );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeKernelDestroy", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeKernelDestroyPrologue( hKernel );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeKernelDestroy", result);
        }

        auto driver_result = pfnDestroy( hKernel );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeKernelDestroyEpilogue( hKernel ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeKernelDestroy", result);
        }

        return logAndPropagateResult("zeKernelDestroy", driver_result);
    }